

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMfse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  int c;
  Acb_Par_t *pPars;
  Acb_Par_t Pars;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkNew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._48_8_ = Abc_FrameReadNtk(pAbc);
  Acb_ParSetDefault((Acb_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_0026a69b:
  iVar1 = Extra_UtilGetopt(argc,argv,"IOWFLCadvwh");
  if (iVar1 == -1) {
    if (Pars._48_8_ == 0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsLogic((Abc_Ntk_t *)Pars._48_8_);
    if (iVar1 == 0) {
      Abc_Print(-1,"This command can only be applied to a logic network.\n");
      return 1;
    }
    pPars._0_4_ = Abc_NtkGetFaninMax((Abc_Ntk_t *)Pars._48_8_);
    if (6 < (int)pPars) {
      Abc_Print(-1,"Command is only applicable to LUT size no more than 6.\n");
      return 1;
    }
    Abc_NtkToSop((Abc_Ntk_t *)Pars._48_8_,-1,1000000000);
    pNtk_00 = Abc_NtkOptMfse((Abc_Ntk_t *)Pars._48_8_,(Acb_Par_t *)&pPars);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Command \"mfse\" has failed.\n");
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
    return 0;
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_0026aac4;
    }
    Pars.nWinNodeMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nWinNodeMax;
    break;
  default:
    goto LAB_0026aac4;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0026aac4;
    }
    Pars.nTfoLevMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nTfoLevMax;
    break;
  case 0x49:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
      goto LAB_0026aac4;
    }
    Pars.nLutSize = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nLutSize;
    break;
  case 0x4c:
    if (globalUtilOptind < argc) goto LAB_0026a8c5;
    Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
    goto LAB_0026aac4;
  case 0x4f:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
      goto LAB_0026aac4;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    uVar2 = pPars._4_4_;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_0026aac4;
    }
    Pars.nTfiLevMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nTfiLevMax;
    break;
  case 0x61:
    Pars.fUseAshen = Pars.fUseAshen ^ 1;
    goto LAB_0026a69b;
  case 100:
    Pars.nBTLimit = Pars.nBTLimit ^ 1;
    goto LAB_0026a69b;
  case 0x68:
    goto LAB_0026aac4;
  case 0x76:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_0026a69b;
  case 0x77:
    Pars.fMoreEffort = Pars.fMoreEffort ^ 1;
    goto LAB_0026a69b;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar2 < 0) {
LAB_0026aac4:
    Abc_Print(-2,"usage: mfse [-IOWFLC <num>] [-advwh]\n");
    Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
    Abc_Print(-2,"\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",
              (ulong)(uint)Pars.nLutSize);
    Abc_Print(-2,"\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
              (ulong)pPars._4_4_);
    Abc_Print(-2,"\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",
              (ulong)(uint)Pars.nTfiLevMax);
    Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
              (ulong)(uint)Pars.nTfoLevMax);
    Abc_Print(-2,
              "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
              ,(ulong)(uint)Pars.nFanoutMax);
    Abc_Print(-2,
              "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nWinNodeMax);
    pcVar3 = "delay";
    if (Pars.fUseAshen != 0) {
      pcVar3 = "area";
    }
    Abc_Print(-2,"\t-a       : toggle minimizing area [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.nBTLimit != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fArea != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fMoreEffort != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",pcVar3
             );
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_0026a69b;
LAB_0026a8c5:
  Pars.nFanoutMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((Pars.nFanoutMax < -1000000000) || (1000000000 < Pars.nFanoutMax)) goto LAB_0026aac4;
  goto LAB_0026a69b;
}

Assistant:

int Abc_CommandMfse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkOptMfse( Abc_Ntk_t * pNtk, Acb_Par_t * pPars );
    Abc_Ntk_t * pNtkNew, * pNtk = Abc_FrameReadNtk(pAbc);
    Acb_Par_t Pars, * pPars = &Pars; int c;
    Acb_ParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOWFLCadvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfiLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfiLevMax < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinNodeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinNodeMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < -ABC_INFINITY || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'd':
            pPars->fUseAshen ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Command is only applicable to LUT size no more than 6.\n" );
        return 1;
    }
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    pNtkNew = Abc_NtkOptMfse( pNtk, pPars );
    if ( pNtkNew == NULL )
    {
        Abc_Print( -1, "Command \"mfse\" has failed.\n" );
        return 1;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: mfse [-IOWFLC <num>] [-advwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",             pPars->nTfiLevMax );
    Abc_Print( -2, "\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",            pPars->nWinNodeMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-a       : toggle minimizing area [default = %s]\n",                                      pPars->fArea? "area": "delay" );
    Abc_Print( -2, "\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",                       pPars->fUseAshen? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}